

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cp0_helper.c
# Opt level: O3

void helper_mttc0_tcstatus_mips64(CPUMIPSState_conflict5 *env,target_ulong arg1)

{
  ulong uVar1;
  target_ulong in_RDX;
  int tc;
  
  tc = (int)arg1;
  if ((env->CP0_VPEConf0 & 2) != 0) {
    uVar1 = (long)(ulong)(byte)env->CP0_VPEControl %
            (long)*(int *)((long)env[-3].tcs[0xc].gpr + 0x94);
    in_RDX = uVar1 & 0xffffffff;
    if ((uint32_t)uVar1 != env->current_tc) {
      env->tcs[uVar1 & 0xffffffff].CP0_TCStatus = tc;
      sync_c0_tcstatus(env,tc,in_RDX);
      return;
    }
  }
  (env->active_tc).CP0_TCStatus = tc;
  sync_c0_tcstatus(env,tc,in_RDX);
  return;
}

Assistant:

static CPUMIPSState *mips_cpu_map_tc(CPUMIPSState *env, int *tc)
{
    CPUState *cs;
    // int vpe_idx;
    int tc_idx = *tc;

    if (!(env->CP0_VPEConf0 & (1 << CP0VPEC0_MVP))) {
        /* Not allowed to address other CPUs.  */
        *tc = env->current_tc;
        return env;
    }

    cs = env_cpu(env);
    // vpe_idx = tc_idx / cs->nr_threads;
    *tc = tc_idx % cs->nr_threads;
    return env;

#if 0
    MIPSCPU *cpu;
    CPUState *other_cs;
    other_cs = qemu_get_cpu(vpe_idx);
    if (other_cs == NULL) {
        return env;
    }
    cpu = MIPS_CPU(other_cs);
    return &cpu->env;
#endif
}